

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-attach-file.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  undefined8 extraout_RAX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *pcVar4;
  long lVar5;
  QPDFObjectHandle QVar6;
  QPDFObjectHandle QVar7;
  QPDFObjectHandle QVar8;
  QPDFObjectHandle QVar9;
  QPDFObjectHandle QVar10;
  QPDF q;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  allocator<char> local_34b;
  allocator<char> local_34a;
  allocator<char> local_349;
  QPDFFileSpecObjectHelper fs;
  QPDFEmbeddedFileDocumentHelper efdh;
  QPDFObjectHandle apdict;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string key;
  QPDFObjectHandle ap;
  string local_250 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_248;
  QPDFObjectHandle page;
  QPDFObjectHandle contents;
  string local_200 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  QPDF local_110 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  QPDFObjectHandle annot;
  string local_f0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  QPDF local_e0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  QPDFObjectHandle resources;
  char local_c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  QPDFObjectHandle f1;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [32];
  string local_50 [32];
  
  whoami = (char *)QUtil::getWhoami(*argv);
  lVar5 = 1;
  local_2c8 = (char *)0x0;
  local_2b8 = (char *)0x0;
  local_2c0 = (char *)0x0;
  pcVar4 = (char *)0x0;
  do {
    if (argc <= lVar5) {
      if (((pcVar4 != (char *)0x0) && (local_2c0 != (char *)0x0)) && (local_2c8 != (char *)0x0)) {
        QPDF::QPDF(&q);
        QPDF::processFile((char *)&q,pcVar4);
        operator____qpdf(local_c0,0x1051ae);
        QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&q;
        QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)&f1;
        QPDF::makeIndirectObject(QVar6);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
        QPDFObjectHandle::unparse_abi_cxx11_();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&efdh,
                       "<<  /Font <<    /F1 ",&key);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&efdh,
                       "  >>>>");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_390,"",(allocator<char> *)&local_370);
        QPDFObjectHandle::parse(local_e0,(string *)&q,(string *)&fs);
        QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&q;
        QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)&resources;
        QPDF::makeIndirectObject(QVar7);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&fs);
        std::__cxx11::string::~string((string *)&efdh);
        std::__cxx11::string::~string((string *)&key);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fs,local_2c0,(allocator<char> *)&efdh);
        QUtil::path_basename((string *)&key);
        std::__cxx11::string::~string((string *)&fs);
        poVar3 = std::operator<<((ostream *)&std::cout,whoami);
        poVar3 = std::operator<<(poVar3,": attaching ");
        poVar3 = std::operator<<(poVar3,local_2c0);
        poVar3 = std::operator<<(poVar3," as ");
        poVar3 = std::operator<<(poVar3,(string *)&key);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&efdh,local_2c0,(allocator<char> *)&local_390);
        QPDFFileSpecObjectHelper::createFileSpec((QPDF *)&fs,(string *)&q,(string *)&key);
        std::__cxx11::string::~string((string *)&efdh);
        if (local_2b8 != (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_390,"",(allocator<char> *)&local_370);
          QPDFFileSpecObjectHelper::getEmbeddedFileStream(local_f0);
          QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = extraout_RDX._M_pi;
          QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_f0;
          QPDFEFStreamObjectHelper::QPDFEFStreamObjectHelper
                    ((QPDFEFStreamObjectHelper *)&efdh,QVar10);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
          std::__cxx11::string::~string((string *)&local_390);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_390,local_2b8,(allocator<char> *)&local_370);
          QPDFEFStreamObjectHelper::setSubtype((string *)&efdh);
          std::__cxx11::string::~string((string *)&local_390);
          QPDFEFStreamObjectHelper::~QPDFEFStreamObjectHelper((QPDFEFStreamObjectHelper *)&efdh);
        }
        QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper(&efdh,&q);
        QPDFEmbeddedFileDocumentHelper::replaceEmbeddedFile
                  ((string *)&efdh,(QPDFFileSpecObjectHelper *)&key);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_390,
                   "0 10 m\n10 0 l\n20 10 l\n10 0 m\n10 20 l\n0 0 20 20 re\nS\n",
                   (allocator<char> *)&local_370);
        QPDF::newStream((string *)&ap);
        std::__cxx11::string::~string((string *)&local_390);
        QPDFObjectHandle::getDict();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_390,"/Resources",(allocator<char> *)&local_2a8);
        operator____qpdf((char *)&local_370,0x10527c);
        QPDFObjectHandle::replaceKey((string *)&apdict,(QPDFObjectHandle *)&local_390);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_370._M_string_length);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_390,"/Type",(allocator<char> *)&local_2a8);
        operator____qpdf((char *)&local_370,0x105288);
        QPDFObjectHandle::replaceKey((string *)&apdict,(QPDFObjectHandle *)&local_390);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_370._M_string_length);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_390,"/Subtype",(allocator<char> *)&local_2a8);
        operator____qpdf((char *)&local_370,0x10529a);
        QPDFObjectHandle::replaceKey((string *)&apdict,(QPDFObjectHandle *)&local_390);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_370._M_string_length);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_390,"/BBox",(allocator<char> *)&local_2a8);
        operator____qpdf((char *)&local_370,0x1052a6);
        QPDFObjectHandle::replaceKey((string *)&apdict,(QPDFObjectHandle *)&local_390);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_370._M_string_length);
        std::__cxx11::string::~string((string *)&local_390);
        QPDFObjectHandle::unparse_abi_cxx11_();
        std::operator+(&local_1b0,"<<  /AP <<    /N ",&local_1d0);
        std::operator+(&local_190,&local_1b0,"  >>  /Contents ");
        std::__cxx11::string::string<std::allocator<char>>((string *)&contents,local_2c0,&local_349)
        ;
        QPDFObjectHandle::newUnicodeString(local_200);
        QPDFObjectHandle::unparse_abi_cxx11_();
        std::operator+(&local_170,&local_190,&local_1f0);
        std::operator+(&local_150,&local_170,"  /FS ");
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_a0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&fs.field_0x8);
        QPDFObjectHandle::unparse_abi_cxx11_();
        std::operator+(&local_130,&local_150,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&page);
        std::operator+(&local_2a8,&local_130,"  /NM ");
        std::__cxx11::string::string<std::allocator<char>>(local_50,local_2c0,&local_34a);
        QPDFObjectHandle::newUnicodeString(local_250);
        QPDFObjectHandle::unparse_abi_cxx11_();
        std::operator+(&local_370,&local_2a8,&local_90);
        std::operator+(&local_390,&local_370,
                       "  /Rect [ 72 700 92 720 ]  /Subtype /FileAttachment  /Type /Annot>>");
        std::__cxx11::string::string<std::allocator<char>>(local_70,"",&local_34b);
        QPDFObjectHandle::parse(local_110,(string *)&q,(string *)&local_390);
        QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&q;
        QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)&annot;
        QPDF::makeIndirectObject(QVar8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108);
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_90);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_248);
        std::__cxx11::string::~string(local_50);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&page);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f8);
        std::__cxx11::string::~string((string *)&contents);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_390,
                   "q\nBT\n  102 700 Td\n  /F1 16 Tf\n  (Here is an attachment.) Tj\nET\nQ\n",
                   (allocator<char> *)&local_370);
        QPDF::newStream((string *)&contents);
        std::__cxx11::string::~string((string *)&local_390);
        QPDFObjectHandle::unparse_abi_cxx11_();
        std::operator+(&local_170,"<<  /Annots [ ",&local_190);
        std::operator+(&local_150,&local_170," ]  /Contents ");
        QPDFObjectHandle::unparse_abi_cxx11_();
        std::operator+(&local_130,&local_150,&local_1b0);
        std::operator+(&local_2a8,&local_130,"  /MediaBox [0 0 612 792]  /Resources ");
        QPDFObjectHandle::unparse_abi_cxx11_();
        std::operator+(&local_370,&local_2a8,&local_1d0);
        std::operator+(&local_390,&local_370,"  /Type /Page>>");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,"",(allocator<char> *)&local_90);
        QPDFObjectHandle::parse((QPDF *)&page,(string *)&q,(string *)&local_390);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_190);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_390,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&page);
        QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_390;
        QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)&q;
        QPDF::addPage(QVar9,true);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_390._M_string_length);
        QPDFWriter::QPDFWriter((QPDFWriter *)&local_370,&q,local_2c8);
        QPDFWriter::setQDFMode(SUB81(&local_370,0));
        QPDFWriter::setSuppressOriginalObjectIDs(SUB81(&local_370,0));
        QPDFWriter::setDeterministicID(SUB81(&local_370,0));
        QPDFWriter::write();
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_370._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&page.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&contents.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&annot.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&apdict.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ap.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper(&efdh);
        QPDFFileSpecObjectHelper::~QPDFFileSpecObjectHelper(&fs);
        std::__cxx11::string::~string((string *)&key);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&resources.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&f1.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        QPDF::~QPDF(&q);
        return 0;
      }
LAB_0010410d:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fs,"required arguments were not provided",(allocator<char> *)&efdh);
      usage((string *)&fs);
      std::__cxx11::string::~string((string *)&fs);
      _Unwind_Resume(extraout_RAX);
    }
    __s1 = argv[lVar5];
    pcVar1 = argv[lVar5 + 1];
    iVar2 = strcmp(__s1,"--infile");
    if (iVar2 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fs,"--infile takes an argument",(allocator<char> *)&efdh);
      if (pcVar1 == (char *)0x0) {
        usage((string *)&fs);
LAB_001040aa:
        usage((string *)&fs);
LAB_001040b4:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&efdh,__s1,(allocator<char> *)&key);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fs,
                       "unknown argument ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&efdh);
        usage((string *)&fs);
LAB_001040ef:
        usage((string *)&fs);
LAB_001040f9:
        usage((string *)&fs);
        goto LAB_00104103;
      }
      std::__cxx11::string::~string((string *)&fs);
      pcVar4 = pcVar1;
    }
    else {
      iVar2 = strcmp(__s1,"--password");
      if (iVar2 != 0) {
        iVar2 = strcmp(__s1,"--attachment");
        if (iVar2 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fs,"--attachment takes an argument",(allocator<char> *)&efdh);
          if (pcVar1 != (char *)0x0) {
            std::__cxx11::string::~string((string *)&fs);
            local_2c0 = pcVar1;
            goto LAB_0010365a;
          }
          goto LAB_001040f9;
        }
        iVar2 = strcmp(__s1,"--outfile");
        if (iVar2 != 0) {
          iVar2 = strcmp(__s1,"--mimetype");
          if (iVar2 != 0) goto LAB_001040b4;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fs,"--mimetype takes an argument",(allocator<char> *)&efdh);
          if (pcVar1 != (char *)0x0) {
            std::__cxx11::string::~string((string *)&fs);
            local_2b8 = pcVar1;
            goto LAB_0010365a;
          }
          goto LAB_001040ef;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fs,"--outfile takes an argument",(allocator<char> *)&efdh);
        if (pcVar1 != (char *)0x0) {
          std::__cxx11::string::~string((string *)&fs);
          local_2c8 = pcVar1;
          goto LAB_0010365a;
        }
LAB_00104103:
        usage((string *)&fs);
        goto LAB_0010410d;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fs,"--password takes an argument",(allocator<char> *)&efdh);
      if (pcVar1 == (char *)0x0) goto LAB_001040aa;
      std::__cxx11::string::~string((string *)&fs);
    }
LAB_0010365a:
    lVar5 = lVar5 + 2;
  } while( true );
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    char const* infilename = nullptr;
    char const* password = nullptr;
    char const* attachment = nullptr;
    char const* outfilename = nullptr;
    char const* mimetype = nullptr;

    auto check_arg = [](char const* arg, std::string const& msg) {
        if (arg == nullptr) {
            usage(msg);
        }
    };

    for (int i = 1; i < argc; ++i) {
        char* arg = argv[i];
        char* next = argv[i + 1];
        if (strcmp(arg, "--infile") == 0) {
            check_arg(next, "--infile takes an argument");
            infilename = next;
            ++i;
        } else if (strcmp(arg, "--password") == 0) {
            check_arg(next, "--password takes an argument");
            password = next;
            ++i;
        } else if (strcmp(arg, "--attachment") == 0) {
            check_arg(next, "--attachment takes an argument");
            attachment = next;
            ++i;
        } else if (strcmp(arg, "--outfile") == 0) {
            check_arg(next, "--outfile takes an argument");
            outfilename = next;
            ++i;
        } else if (strcmp(arg, "--mimetype") == 0) {
            check_arg(next, "--mimetype takes an argument");
            mimetype = next;
            ++i;
        } else {
            usage("unknown argument " + std::string(arg));
        }
    }
    if (!(infilename && attachment && outfilename)) {
        usage("required arguments were not provided");
    }

    try {
        process(infilename, password, attachment, mimetype, outfilename);
    } catch (std::exception& e) {
        std::cerr << whoami << " exception: " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}